

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_utf8_trim_whitespaces_right(char *str)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  long in_FS_OFFSET;
  int cursor;
  char *last;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = str_length((char *)0x259155);
  local_10 = (char *)(in_RDI + iVar1);
  do {
    iVar2 = str_utf8_decode(&local_10);
    iVar2 = str_utf8_is_whitespace(iVar2);
    if (iVar2 == 0) break;
    *(undefined1 *)(in_RDI + iVar1) = 0;
    iVar1 = str_utf8_rewind((char *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc);
    local_10 = (char *)(in_RDI + iVar1);
  } while (iVar1 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void str_utf8_trim_whitespaces_right(char *str)
{
	int cursor = str_length(str);
	const char *last = str + cursor;
	while(str_utf8_is_whitespace(str_utf8_decode(&last)))
	{
		str[cursor] = 0;
		cursor = str_utf8_rewind(str, cursor);
		last = str + cursor;
		if(cursor == 0)
		{
			break;
		}
	}
}